

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O1

ssize_t __thiscall
QNativeSocketEngine::write(QNativeSocketEngine *this,int __fd,void *__buf,size_t __n)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  qint64 qVar2;
  size_t __n_00;
  undefined4 in_register_00000034;
  char *__buf_00;
  
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  __buf_00 = (char *)CONCAT44(in_register_00000034,__fd);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 == '\0') {
    write((int)this,__buf_00,__n_00);
  }
  else {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketState == ConnectedState) {
      qVar2 = QNativeSocketEnginePrivate::nativeWrite
                        (this_00,(char *)CONCAT44(in_register_00000034,__fd),(qint64)__buf);
      return qVar2;
    }
    write((int)this,__buf_00,__n_00);
  }
  return -1;
}

Assistant:

qint64 QNativeSocketEngine::write(const char *data, qint64 size)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::write(), -1);
    Q_CHECK_STATE(QNativeSocketEngine::write(), QAbstractSocket::ConnectedState, -1);
    return d->nativeWrite(data, size);
}